

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::GetItem
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,DynamicObject *instance,
          Var originalInstance,uint32 index,Var *value,ScriptContext *requestContext)

{
  Var aValue;
  bool bVar1;
  BOOL BVar2;
  IndexPropertyDescriptor *in_RAX;
  RecyclableObject *pRVar3;
  IndexPropertyDescriptor *local_38;
  IndexPropertyDescriptor *descriptor;
  
  local_38 = in_RAX;
  BVar2 = JavascriptArray::DirectGetItemAt<void*>(&arr->super_JavascriptArray,index,value);
  if (BVar2 == 0) {
    bVar1 = IndexPropertyDescriptorMap::TryGetReference
                      ((this->indexPropertyMap).ptr,index,&local_38);
    if ((bVar1) && ((local_38->Attributes & 8) == 0)) {
      aValue = (local_38->Getter).ptr;
      if (aValue == (Var)0x0) {
        pRVar3 = ScriptContext::GetMissingItemResult(requestContext);
      }
      else {
        pRVar3 = VarTo<Js::RecyclableObject>(aValue);
        pRVar3 = (RecyclableObject *)
                 JavascriptOperators::CallGetter(pRVar3,originalInstance,requestContext);
      }
      BVar2 = 1;
    }
    else {
      pRVar3 = ScriptContext::GetMissingItemResult(requestContext);
      BVar2 = 0;
    }
    *value = pRVar3;
  }
  else {
    BVar2 = 1;
  }
  return BVar2;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::GetItem(ES5Array* arr, DynamicObject* instance, Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
        if (arr->DirectGetItemAt<Var>(index, value))
        {
            return true;
        }

        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                *value = requestContext->GetMissingItemResult();
                return false;
            }

            if (descriptor->Getter)
            {
                RecyclableObject* func = VarTo<RecyclableObject>(descriptor->Getter);
                *value = Js::JavascriptOperators::CallGetter(func, originalInstance, requestContext);
            }
            else
            {
                *value = requestContext->GetMissingItemResult();
            }
            return true;
        }

        *value = requestContext->GetMissingItemResult();
        return false;
    }